

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O3

void decaf_448_precompute_wnafs(niels_t *out,decaf_448_point_s *base)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  niels_t *__dest;
  gf_448_t zs [32];
  gf_448_t zis [32];
  pniels_t tmp [32];
  gf_448_s local_3060 [32];
  gf_448_s local_2860 [32];
  anon_struct_256_2_948a309a local_2060 [32];
  
  prepare_wnaf_table((pniels_t *)local_2060,base,5);
  lVar9 = 0;
  __dest = out;
  do {
    lVar1 = lVar9 * 4;
    memcpy(__dest,(void *)((long)local_2060[0].n[0].a[0].limb + lVar1),0xc0);
    uVar2 = *(undefined8 *)((long)local_2060[0].z[0].limb + lVar1 + 8);
    uVar3 = *(undefined8 *)((long)local_2060[0].z[0].limb + lVar1 + 0x10);
    uVar4 = *(undefined8 *)((long)local_2060[0].z[0].limb + lVar1 + 0x18);
    uVar5 = *(undefined8 *)((long)local_2060[0].z[0].limb + lVar1 + 0x20);
    uVar6 = *(undefined8 *)((long)local_2060[0].z[0].limb + lVar1 + 0x28);
    uVar7 = *(undefined8 *)((long)local_2060[0].z[0].limb + lVar1 + 0x30);
    uVar8 = *(undefined8 *)((long)local_2060[0].z[0].limb + lVar1 + 0x38);
    *(undefined8 *)((long)local_3060[0].limb + lVar9) =
         *(undefined8 *)((long)local_2060[0].z[0].limb + lVar1);
    *(undefined8 *)((long)local_3060[0].limb + lVar9 + 8) = uVar2;
    *(undefined8 *)((long)local_3060[0].limb + lVar9 + 0x10) = uVar3;
    *(undefined8 *)((long)local_3060[0].limb + lVar9 + 0x18) = uVar4;
    *(undefined8 *)((long)local_3060[0].limb + lVar9 + 0x20) = uVar5;
    *(undefined8 *)((long)local_3060[0].limb + lVar9 + 0x28) = uVar6;
    *(undefined8 *)((long)local_3060[0].limb + lVar9 + 0x30) = uVar7;
    *(undefined8 *)((long)local_3060[0].limb + lVar9 + 0x38) = uVar8;
    lVar9 = lVar9 + 0x40;
    __dest = __dest + 1;
  } while (lVar9 != 0x800);
  batch_normalize_niels(out,(gf_448_t *)local_3060,(gf_448_t *)local_2860,0x20);
  decaf_bzero(local_2060,0x2000);
  decaf_bzero(local_3060,0x800);
  decaf_bzero(local_2860,0x800);
  return;
}

Assistant:

void API_NS(precompute_wnafs) (
    niels_t out[1<<DECAF_WNAF_FIXED_TABLE_BITS],
    const point_t base
) {
    pniels_t tmp[1<<DECAF_WNAF_FIXED_TABLE_BITS];
    gf zs[1<<DECAF_WNAF_FIXED_TABLE_BITS], zis[1<<DECAF_WNAF_FIXED_TABLE_BITS];
    int i;
    prepare_wnaf_table(tmp,base,DECAF_WNAF_FIXED_TABLE_BITS);
    for (i=0; i<1<<DECAF_WNAF_FIXED_TABLE_BITS; i++) {
        memcpy(out[i], tmp[i]->n, sizeof(niels_t));
        gf_copy(zs[i], tmp[i]->z);
    }
    batch_normalize_niels(out, (const gf *)zs, zis, 1<<DECAF_WNAF_FIXED_TABLE_BITS);
    
    decaf_bzero(tmp,sizeof(tmp));
    decaf_bzero(zs,sizeof(zs));
    decaf_bzero(zis,sizeof(zis));
}